

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task.cpp
# Opt level: O0

MPP_RET mpp_task_meta_get_buffer(MppTask task,MppMetaKey key,MppBuffer *buffer)

{
  MPP_RET MVar1;
  MPP_RET ret;
  MppTaskImpl *impl;
  MppBuffer *buffer_local;
  MppMetaKey key_local;
  MppTask task_local;
  
  MVar1 = check_mpp_task_name(task);
  if (MVar1 == MPP_OK) {
    task_local._4_4_ = mpp_meta_get_buffer(*(MppMeta *)((long)task + 0x28),key,buffer);
    if (task_local._4_4_ != MPP_OK) {
      *buffer = (MppBuffer)0x0;
    }
  }
  else {
    task_local._4_4_ = MPP_NOK;
  }
  return task_local._4_4_;
}

Assistant:

MPP_RET mpp_task_meta_get_buffer(MppTask task, MppMetaKey key, MppBuffer *buffer)
{
    if (check_mpp_task_name(task))
        return MPP_NOK;

    MppTaskImpl *impl = (MppTaskImpl *)task;
    MPP_RET ret = mpp_meta_get_buffer(impl->meta, key, buffer);
    if (ret)
        *buffer = NULL;
    return ret;
}